

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::basicFeasibilityChangeBtran(HEkkPrimal *this)

{
  int iVar1;
  HighsSimplexAnalysis *this_00;
  HEkk *pHVar2;
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3d,0);
  pHVar2 = this->ekk_instance_;
  this_00 = this->analysis;
  iVar1 = (pHVar2->lp_).num_row_;
  if (this_00->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore
              (this_00,2,&this->col_basic_feasibility_change,
               (pHVar2->info_).col_basic_feasibility_change_density);
    pHVar2 = this->ekk_instance_;
    this_00 = this->analysis;
  }
  HSimplexNla::btran(&pHVar2->simplex_nla_,&this->col_basic_feasibility_change,
                     (pHVar2->info_).col_basic_feasibility_change_density,
                     this_00->pointer_serial_factor_clocks);
  if (this->analysis->analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this->analysis,2,&this->col_basic_feasibility_change)
    ;
  }
  HEkk::updateOperationResultDensity
            (this->ekk_instance_,(double)(this->col_basic_feasibility_change).count / (double)iVar1,
             &(this->ekk_instance_->info_).col_basic_feasibility_change_density);
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3d,0);
  return;
}

Assistant:

void HEkkPrimal::basicFeasibilityChangeBtran() {
  // Performs BTRAN on col_basic_feasibility_change. Make sure that
  // col_basic_feasibility_change.count is large (>lp_.num_row_ to be
  // sure) rather than 0 if the indices of the RHS (and true value of
  // col_basic_feasibility_change.count) isn't known.
  analysis->simplexTimerStart(BtranBasicFeasibilityChangeClock);
  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(
        kSimplexNlaBtranBasicFeasibilityChange, col_basic_feasibility_change,
        ekk_instance_.info_.col_basic_feasibility_change_density);
  ekk_instance_.simplex_nla_.btran(
      col_basic_feasibility_change,
      ekk_instance_.info_.col_basic_feasibility_change_density,
      analysis->pointer_serial_factor_clocks);

  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaBtranBasicFeasibilityChange,
                                   col_basic_feasibility_change);
  const double local_col_basic_feasibility_change_density =
      (double)col_basic_feasibility_change.count / solver_num_row;
  ekk_instance_.updateOperationResultDensity(
      local_col_basic_feasibility_change_density,
      ekk_instance_.info_.col_basic_feasibility_change_density);
  analysis->simplexTimerStop(BtranBasicFeasibilityChangeClock);
}